

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O1

sgr_ostream_wrapper * __thiscall
cpp_sgr::sgr_ostream_wrapper::operator<<(sgr_ostream_wrapper *this,sgr *c)

{
  string local_30;
  
  sgr::toString_abi_cxx11_(&local_30,c);
  std::__ostream_insert<char,std::char_traits<char>>
            (&this->stream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

sgr_ostream_wrapper & sgr_ostream_wrapper::operator<<(const sgr & c)
	{
		stream << c.toString();
		return *this;
	}